

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_GetCommandLineOptionTest_NameExistsAndWasAssigned::Run(void)

{
  FlagSaver fs;
  FlagSaver FStack_38;
  string local_30;
  
  FlagSaver::FlagSaver(&FStack_38);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineOptionTest","NameExistsAndWasAssigned");
  fLI::FLAGS_test_int32 = 400;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30.field_2._M_allocated_capacity._0_7_ = 0x6562206c6c6977;
  local_30.field_2._M_local_buf[7] = ' ';
  local_30.field_2._8_7_ = 0x6465676e616863;
  local_30._M_string_length = 0xf;
  local_30.field_2._M_local_buf[0xf] = '\0';
  GetCommandLineOption("test_int32",&local_30);
  _GLOBAL__N_1::Test_GetCommandLineOptionTest_NameExistsAndWasAssigned::Run();
  return;
}

Assistant:

TEST(GetCommandLineOptionTest, NameExistsAndWasAssigned) {
  FLAGS_test_int32 = 400;
  string value("will be changed");
  const bool r = GetCommandLineOption("test_int32", &value);
  EXPECT_TRUE(r);
  EXPECT_EQ("400", value);
}